

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeCompleteInformationValues
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  allocator<char> *__s;
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  double *pdVar4;
  reference pvVar5;
  ostream *poVar6;
  allocator<char> *in_RDI;
  double c;
  Index ja;
  double bestValue;
  Index i;
  vector<double,_std::allocator<double>_> *in_stack_00000128;
  undefined8 in_stack_ffffffffffffff48;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  double local_60;
  uint local_54;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *local_50 [3];
  allocator<char> local_31;
  string local_30 [36];
  uint local_c;
  
  __s = in_RDI + 0x150;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
  BayesianGameBase::GetNrJointTypes();
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_c = 0;
  while( true ) {
    uVar1 = (ulong)local_c;
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x150));
    if (uVar1 == sVar2) break;
    if (local_c % 100 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,(char *)__s,in_RDI);
      (**(code **)(*(long *)in_RDI + 8))(in_RDI,local_30);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator(&local_31);
    }
    local_50[0] = (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)0xffefffffffffffff;
    local_54 = 0;
    while( true ) {
      uVar1 = (ulong)local_54;
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
      uVar3 = BayesianGameBase::GetNrJointActions();
      if (uVar1 == uVar3) break;
      local_60 = GetContribution(in_stack_ffffffffffffff50,
                                 (Index)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                 (Index)in_stack_ffffffffffffff48);
      pdVar4 = std::max<double>(&local_60,(double *)local_50);
      local_50[0] = (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)*pdVar4;
      local_54 = local_54 + 1;
    }
    in_stack_ffffffffffffff50 = local_50[0];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x150),(ulong)local_c);
    *pvVar5 = (value_type)in_stack_ffffffffffffff50;
    local_c = local_c + 1;
  }
  if (2 < *(int *)(in_RDI + 0x110)) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Complete information values: ");
    PrintTools::SoftPrintVector<double>(in_stack_00000128);
    poVar6 = std::operator<<(poVar6,(string *)&stack0xffffffffffffff80);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  return;
}

Assistant:

void ComputeCompleteInformationValues()
    {
        _m_completeInformationValues.resize(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=_m_completeInformationValues.size();++i)
        {
            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded (in ComputeCompleteInformationValues())");

            double bestValue=-DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                bestValue=std::max(c,bestValue);
            }
            _m_completeInformationValues[i]=bestValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Complete information values: "
                      << SoftPrintVector(_m_completeInformationValues)
                      << std::endl;
    }